

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_types_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<float> *paVar1;
  allocator<short> *this;
  allocator<ximu::Vector3<float>_> *this_00;
  allocator<ximu::Vector3<short>_> *this_01;
  allocator<unsigned_short> *this_02;
  float c_00;
  float d;
  float e;
  float f;
  float g;
  short c_01;
  short d_00;
  short e_00;
  short f_00;
  short g_00;
  unsigned_short a2;
  unsigned_short a4;
  initializer_list<unsigned_short> __l;
  initializer_list<ximu::Vector3<short>_> __l_00;
  initializer_list<ximu::Vector3<float>_> __l_01;
  initializer_list<short> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<float> __l_05;
  initializer_list<float> __l_06;
  bool bVar2;
  uchar uVar3;
  unsigned_short uVar4;
  short sVar5;
  short sVar6;
  base_type bVar7;
  int iVar8;
  size_t sVar9;
  tm *__src;
  iterator begin;
  iterator end;
  reference pvVar10;
  base_type pfVar11;
  undefined4 extraout_var;
  reference pvVar12;
  reference pvVar13;
  base_type pVVar14;
  undefined4 extraout_var_00;
  reference pvVar15;
  base_type pVVar16;
  undefined4 extraout_var_01;
  reference pvVar17;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar18;
  float fVar19;
  float fVar20;
  Quaternion<float> QVar21;
  bool local_7c2;
  RawBatteryAndThermometerData local_688;
  short local_684;
  short local_682;
  RawBatteryAndThermometerData rbatd;
  short _themp1s;
  short _batVolt1s;
  short _themp0s;
  short _batVolt0s;
  CalBatteryAndThermometerData cbatd;
  float _themp1f;
  float _batVolt1f;
  float _themp0f;
  float _batVolt0f;
  PWMOutputData pwmOutputData;
  undefined1 local_640 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> usTestSet;
  Vector3<short> local_61c;
  Vector3<short> local_616;
  Vector3<short> local_610;
  undefined1 local_60a [8];
  RawAdxl345BusData rawBusData;
  Vector3<short> local_5ea;
  Vector3<short> local_5e4;
  Vector3<short> local_5de;
  iterator local_5d8;
  size_type local_5d0;
  undefined1 local_5c8 [8];
  vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_> vec3sTestSet;
  Vector3<float> local_5a0;
  Vector3<float> local_594;
  Vector3<float> local_588;
  undefined1 local_57c [8];
  CalAdxl345BusData calBusData;
  Vector3<float> local_53c;
  Vector3<float> local_530;
  Vector3<float> local_524;
  iterator local_518;
  size_type local_510;
  undefined1 local_508 [8];
  vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_> vec3fTestSet;
  RawAnalogueInputData rawInTest;
  undefined1 local_4b8 [8];
  vector<short,_std::allocator<short>_> sTestSet;
  CalAnalogueInputData carInTest;
  undefined1 local_440 [8];
  vector<float,_std::allocator<float>_> fTestSet;
  DigitalIOData diod1;
  size_t sStack_420;
  size_t portIndex;
  DigitalPortBits dpb2;
  DigitalPortBits dpb1;
  undefined1 local_40a [12];
  undefined1 local_3fe [12];
  undefined1 local_3f2 [12];
  undefined1 local_3e6 [14];
  RawInertialAndMagneticData riamd;
  Vector3s magn_r;
  Vector3s acce_r;
  Vector3s gyro_r;
  undefined1 local_3b0 [24];
  undefined1 local_398 [24];
  undefined1 local_380 [24];
  undefined1 local_368 [24];
  undefined1 local_350 [8];
  CalInertialAndMagneticData ciamd;
  Vector3f magn;
  Vector3f acce;
  Vector3f gyro;
  vector<float,_std::allocator<float>_> local_2f0;
  value_type local_2d8;
  value_type local_2d4;
  float c;
  float b;
  float a;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined4 local_2a8;
  iterator local_2a0;
  size_type local_298;
  undefined1 local_290 [8];
  vector<float,_std::allocator<float>_> rotationMatrix;
  vector<float,_std::allocator<float>_> local_260;
  undefined1 local_248 [8];
  vector<float,_std::allocator<float>_> eulerAngles2;
  undefined1 local_210 [8];
  vector<float,_std::allocator<float>_> eulerAngles1;
  Quaternion<float> local_1e8;
  undefined1 local_1d8 [8];
  QuaternionData q7;
  vector<float,_std::allocator<float>_> local_1b0;
  undefined1 local_194 [8];
  QuaternionData q6;
  QuaternionData q5;
  undefined1 local_15c [8];
  QuaternionData q4;
  allocator<float> local_139;
  float local_138 [4];
  iterator local_128;
  size_type local_120;
  undefined1 local_118 [8];
  vector<float,_std::allocator<float>_> qData;
  QuaternionData q3;
  Quaternion<float> q2;
  Quaternion<float> q1;
  DateTimeData dtd2;
  tm l_tm;
  time_t tt;
  time_point now;
  DateTimeData dtd1;
  RegisterData r2;
  RegisterData r1;
  char **argv_local;
  int argc_local;
  
  ximu::RegisterData::RegisterData(&r2,ALGORITHM_TARE_QUAT_0,1.234);
  uVar4 = ximu::RegisterData::value(&r2);
  if (uVar4 != 0x7fff) {
    return 1;
  }
  ximu::RegisterData::RegisterData((RegisterData *)&dtd1._seconds,BATTERY_BIAS,0x94);
  fVar19 = ximu::RegisterData::floatValue((RegisterData *)&dtd1._seconds);
  if ((fVar19 != 0.578125) || (NAN(fVar19))) {
    return 1;
  }
  ximu::DateTimeData::DateTimeData((DateTimeData *)&now);
  sVar9 = ximu::DateTimeData::year((DateTimeData *)&now);
  if (((((sVar9 != 2000) || (sVar9 = ximu::DateTimeData::month((DateTimeData *)&now), sVar9 != 1))
       || (sVar9 = ximu::DateTimeData::day((DateTimeData *)&now), sVar9 != 1)) ||
      ((sVar9 = ximu::DateTimeData::hours((DateTimeData *)&now), sVar9 != 0 ||
       (sVar9 = ximu::DateTimeData::minutes((DateTimeData *)&now), sVar9 != 0)))) ||
     (sVar9 = ximu::DateTimeData::seconds((DateTimeData *)&now), sVar9 != 0)) {
    return 1;
  }
  ximu::DateTimeData::year((DateTimeData *)&now,0x7d1);
  ximu::DateTimeData::month((DateTimeData *)&now,2);
  ximu::DateTimeData::day((DateTimeData *)&now,3);
  ximu::DateTimeData::hours((DateTimeData *)&now,4);
  ximu::DateTimeData::minutes((DateTimeData *)&now,5);
  ximu::DateTimeData::seconds((DateTimeData *)&now,6);
  sVar9 = ximu::DateTimeData::year((DateTimeData *)&now);
  if (((sVar9 != 0x7d1) || (sVar9 = ximu::DateTimeData::month((DateTimeData *)&now), sVar9 != 2)) ||
     ((sVar9 = ximu::DateTimeData::day((DateTimeData *)&now), sVar9 != 3 ||
      (((sVar9 = ximu::DateTimeData::hours((DateTimeData *)&now), sVar9 != 4 ||
        (sVar9 = ximu::DateTimeData::minutes((DateTimeData *)&now), sVar9 != 5)) ||
       (sVar9 = ximu::DateTimeData::seconds((DateTimeData *)&now), sVar9 != 6)))))) {
    return 1;
  }
  tt = std::chrono::_V2::system_clock::now();
  l_tm.tm_zone = (char *)std::chrono::_V2::system_clock::to_time_t((time_point *)&tt);
  __src = localtime((time_t *)&l_tm.tm_zone);
  memcpy(&dtd2._seconds,__src,0x38);
  ximu::DateTimeData::DateTimeData((DateTimeData *)&q1._y,(tm *)&dtd2._seconds);
  sVar9 = ximu::DateTimeData::year((DateTimeData *)&q1._y);
  if ((((long)l_tm.tm_mday != sVar9) ||
      (sVar9 = ximu::DateTimeData::month((DateTimeData *)&q1._y), (long)l_tm.tm_hour != sVar9)) ||
     (((sVar9 = ximu::DateTimeData::day((DateTimeData *)&q1._y), (long)l_tm.tm_min != sVar9 ||
       ((sVar9 = ximu::DateTimeData::hours((DateTimeData *)&q1._y), (long)l_tm.tm_sec != sVar9 ||
        (sVar9 = ximu::DateTimeData::minutes((DateTimeData *)&q1._y),
        (long)dtd2._seconds._4_4_ != sVar9)))) ||
      (sVar9 = ximu::DateTimeData::seconds((DateTimeData *)&q1._y),
      (long)(int)dtd2._seconds != sVar9)))) {
    return 1;
  }
  ximu::Quaternion<float>::Quaternion((Quaternion<float> *)&q2._y);
  ximu::Quaternion<float>::Quaternion((Quaternion<float> *)&q3._y,1.0,0.0,0.0,0.0);
  ximu::Quaternion<float>::Quaternion
            ((Quaternion<float> *)
             &qData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_138[0] = 1.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  local_138[3] = 0.0;
  local_128 = local_138;
  local_120 = 4;
  std::allocator<float>::allocator(&local_139);
  __l_06._M_len = local_120;
  __l_06._M_array = local_128;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_118,__l_06,&local_139);
  std::allocator<float>::~allocator(&local_139);
  begin = std::vector<float,_std::allocator<float>_>::begin
                    ((vector<float,_std::allocator<float>_> *)local_118);
  end = std::vector<float,_std::allocator<float>_>::end
                  ((vector<float,_std::allocator<float>_> *)local_118);
  ximu::Quaternion<float>::
  Quaternion<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
            ((Quaternion<float> *)local_15c,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             begin._M_current,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)end._M_current
            );
  bVar2 = ximu::operator!=((Quaternion<float> *)&q2._y,(Quaternion<float> *)&q3._y);
  if (((bVar2) ||
      (bVar2 = ximu::operator!=((Quaternion<float> *)&q2._y,
                                (Quaternion<float> *)
                                &qData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage), bVar2)) ||
     (bVar2 = ximu::operator!=((Quaternion<float> *)&q2._y,(Quaternion<float> *)local_15c), bVar2))
  {
    argv_local._4_4_ = 1;
    goto LAB_0010e088;
  }
  ximu::Quaternion<float>::Quaternion((Quaternion<float> *)&q6._y,1.0,2.0,3.0,4.0);
  ximu::Quaternion<float>::normalize((Quaternion<float> *)&q6._y);
  ximu::Quaternion<float>::Quaternion((Quaternion<float> *)local_194,0.182,0.365,0.547,0.732);
  ximu::Quaternion<float>::values(&local_1b0,(Quaternion<float> *)&q6._y);
  ximu::Quaternion<float>::values
            ((vector<float,_std::allocator<float>_> *)&q7._y,(Quaternion<float> *)local_194);
  bVar2 = ximu::Utility::isWithinError<std::vector<float,std::allocator<float>>,float>
                    (&local_1b0,(vector<float,_std::allocator<float>_> *)&q7._y,0.01);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&q7._y);
  std::vector<float,_std::allocator<float>_>::~vector(&local_1b0);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    argv_local._4_4_ = 1;
    goto LAB_0010e088;
  }
  ximu::Quaternion<float>::Quaternion((Quaternion<float> *)local_1d8,1.0,2.0,3.0,4.0);
  QVar21 = ximu::Quaternion<float>::conjugate((Quaternion<float> *)local_1d8);
  local_1e8._8_8_ = QVar21._8_8_;
  local_1e8._0_8_ = QVar21._0_8_;
  ximu::Quaternion<float>::Quaternion
            ((Quaternion<float> *)
             &eulerAngles1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,1.0,-2.0,-3.0,-4.0);
  bVar2 = ximu::operator!=(&local_1e8,
                           (Quaternion<float> *)
                           &eulerAngles1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    argv_local._4_4_ = 1;
    goto LAB_0010e088;
  }
  eulerAngles2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x429d6148;
  paVar1 = (allocator<float> *)
           ((long)&eulerAngles2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<float>::allocator(paVar1);
  __l_05._M_len = 3;
  __l_05._M_array =
       (iterator)
       ((long)&eulerAngles2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_210,__l_05,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&eulerAngles2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  ximu::Quaternion<float>::eulerAngles
            ((vector<float,_std::allocator<float>_> *)local_248,(Quaternion<float> *)&q6._y);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_260,(vector<float,_std::allocator<float>_> *)local_210);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &rotationMatrix.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_248);
  bVar2 = ximu::Utility::isWithinError<std::vector<float,std::allocator<float>>,float>
                    (&local_260,
                     (vector<float,_std::allocator<float>_> *)
                     &rotationMatrix.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0.001);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &rotationMatrix.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector(&local_260);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    local_2b8 = 0x3f6ed917beaa7efa;
    uStack_2b0 = 0x3f2a7efa3f3ba5e3;
    _a = 0x3f2a7efabf2a7efa;
    uStack_2c0 = 0x3e0831273eaa7efa;
    local_2a8 = 0x3e083127;
    local_2a0 = &a;
    local_298 = 9;
    std::allocator<float>::allocator((allocator<float> *)((long)&b + 3));
    __l_04._M_len = local_298;
    __l_04._M_array = local_2a0;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_290,__l_04,
               (allocator<float> *)((long)&b + 3));
    std::allocator<float>::~allocator((allocator<float> *)((long)&b + 3));
    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_290,6);
    c = *pvVar10;
    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_290,7);
    local_2d4 = *pvVar10;
    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_290,8);
    local_2d8 = *pvVar10;
    ximu::Quaternion<float>::rotationMatrix(&local_2f0,(Quaternion<float> *)&q6._y);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&gyro._y,
               (vector<float,_std::allocator<float>_> *)local_290);
    bVar2 = ximu::Utility::isWithinError<std::vector<float,std::allocator<float>>,float>
                      (&local_2f0,(vector<float,_std::allocator<float>_> *)&gyro._y,0.01);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)&gyro._y);
    std::vector<float,_std::allocator<float>_>::~vector(&local_2f0);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      ximu::Vector3<float>::Vector3((Vector3<float> *)&acce._y,1.0,2.0,3.0);
      ximu::Vector3<float>::Vector3((Vector3<float> *)&magn._y,4.0,5.0,6.0);
      ximu::Vector3<float>::Vector3((Vector3<float> *)&ciamd._magnetometer._y,7.0,8.0,9.0);
      ximu::CalInertialAndMagneticData::CalInertialAndMagneticData
                ((CalInertialAndMagneticData *)local_350,(Vector3f *)&acce._y,(Vector3f *)&magn._y,
                 (Vector3f *)&ciamd._magnetometer._y);
      ximu::CalInertialAndMagneticData::gyroscope((CalInertialAndMagneticData *)(local_368 + 0xc));
      fVar19 = ximu::Vector3<float>::x((Vector3<float> *)(local_368 + 0xc));
      fVar20 = ximu::Vector3<float>::x((Vector3<float> *)&acce._y);
      bVar2 = true;
      if ((fVar19 == fVar20) && (!NAN(fVar19) && !NAN(fVar20))) {
        ximu::CalInertialAndMagneticData::gyroscope((CalInertialAndMagneticData *)local_368);
        fVar19 = ximu::Vector3<float>::y((Vector3<float> *)local_368);
        fVar20 = ximu::Vector3<float>::y((Vector3<float> *)&acce._y);
        bVar2 = true;
        if ((fVar19 == fVar20) && (!NAN(fVar19) && !NAN(fVar20))) {
          ximu::CalInertialAndMagneticData::gyroscope
                    ((CalInertialAndMagneticData *)(local_380 + 0xc));
          fVar19 = ximu::Vector3<float>::z((Vector3<float> *)(local_380 + 0xc));
          fVar20 = ximu::Vector3<float>::z((Vector3<float> *)&acce._y);
          bVar2 = true;
          if ((fVar19 == fVar20) && (!NAN(fVar19) && !NAN(fVar20))) {
            ximu::CalInertialAndMagneticData::accelerometer((CalInertialAndMagneticData *)local_380)
            ;
            fVar19 = ximu::Vector3<float>::x((Vector3<float> *)local_380);
            fVar20 = ximu::Vector3<float>::x((Vector3<float> *)&magn._y);
            bVar2 = true;
            if ((fVar19 == fVar20) && (!NAN(fVar19) && !NAN(fVar20))) {
              ximu::CalInertialAndMagneticData::accelerometer
                        ((CalInertialAndMagneticData *)(local_398 + 0xc));
              fVar19 = ximu::Vector3<float>::y((Vector3<float> *)(local_398 + 0xc));
              fVar20 = ximu::Vector3<float>::y((Vector3<float> *)&magn._y);
              bVar2 = true;
              if ((fVar19 == fVar20) && (!NAN(fVar19) && !NAN(fVar20))) {
                ximu::CalInertialAndMagneticData::accelerometer
                          ((CalInertialAndMagneticData *)local_398);
                fVar19 = ximu::Vector3<float>::z((Vector3<float> *)local_398);
                fVar20 = ximu::Vector3<float>::z((Vector3<float> *)&magn._y);
                bVar2 = true;
                if ((fVar19 == fVar20) && (!NAN(fVar19) && !NAN(fVar20))) {
                  ximu::CalInertialAndMagneticData::magnetometer
                            ((CalInertialAndMagneticData *)(local_3b0 + 0xc));
                  fVar19 = ximu::Vector3<float>::x((Vector3<float> *)(local_3b0 + 0xc));
                  fVar20 = ximu::Vector3<float>::x((Vector3<float> *)&ciamd._magnetometer._y);
                  bVar2 = true;
                  if ((fVar19 == fVar20) && (!NAN(fVar19) && !NAN(fVar20))) {
                    ximu::CalInertialAndMagneticData::magnetometer
                              ((CalInertialAndMagneticData *)local_3b0);
                    fVar19 = ximu::Vector3<float>::y((Vector3<float> *)local_3b0);
                    fVar20 = ximu::Vector3<float>::y((Vector3<float> *)&ciamd._magnetometer._y);
                    bVar2 = true;
                    if ((fVar19 == fVar20) && (!NAN(fVar19) && !NAN(fVar20))) {
                      ximu::CalInertialAndMagneticData::magnetometer
                                ((CalInertialAndMagneticData *)&acce_r._z);
                      fVar19 = ximu::Vector3<float>::z((Vector3<float> *)&acce_r._z);
                      fVar20 = ximu::Vector3<float>::z((Vector3<float> *)&ciamd._magnetometer._y);
                      bVar2 = fVar19 != fVar20;
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (bVar2) {
        argv_local._4_4_ = 1;
      }
      else {
        ximu::Vector3<short>::Vector3((Vector3<short> *)&magn_r._z,1,2,3);
        ximu::Vector3<short>::Vector3((Vector3<short> *)&riamd._magnetometer._z,4,5,6);
        ximu::Vector3<short>::Vector3((Vector3<short> *)&riamd._accelerometer._z,7,8,9);
        ximu::RawInertialAndMagneticData::RawInertialAndMagneticData
                  ((RawInertialAndMagneticData *)(local_3e6 + 6),(Vector3s *)&magn_r._z,
                   (Vector3s *)&riamd._magnetometer._z,(Vector3s *)&riamd._accelerometer._z);
        ximu::RawInertialAndMagneticData::gyroscope((RawInertialAndMagneticData *)local_3e6);
        sVar5 = ximu::Vector3<short>::x((Vector3<short> *)local_3e6);
        sVar6 = ximu::Vector3<short>::x((Vector3<short> *)&magn_r._z);
        bVar2 = true;
        if (sVar5 == sVar6) {
          ximu::RawInertialAndMagneticData::gyroscope((RawInertialAndMagneticData *)(local_3f2 + 6))
          ;
          sVar5 = ximu::Vector3<short>::y((Vector3<short> *)(local_3f2 + 6));
          sVar6 = ximu::Vector3<short>::y((Vector3<short> *)&magn_r._z);
          bVar2 = true;
          if (sVar5 == sVar6) {
            ximu::RawInertialAndMagneticData::gyroscope((RawInertialAndMagneticData *)local_3f2);
            sVar5 = ximu::Vector3<short>::z((Vector3<short> *)local_3f2);
            sVar6 = ximu::Vector3<short>::z((Vector3<short> *)&magn_r._z);
            bVar2 = true;
            if (sVar5 == sVar6) {
              ximu::RawInertialAndMagneticData::accelerometer
                        ((RawInertialAndMagneticData *)(local_3fe + 6));
              sVar5 = ximu::Vector3<short>::x((Vector3<short> *)(local_3fe + 6));
              sVar6 = ximu::Vector3<short>::x((Vector3<short> *)&riamd._magnetometer._z);
              bVar2 = true;
              if (sVar5 == sVar6) {
                ximu::RawInertialAndMagneticData::accelerometer
                          ((RawInertialAndMagneticData *)local_3fe);
                sVar5 = ximu::Vector3<short>::y((Vector3<short> *)local_3fe);
                sVar6 = ximu::Vector3<short>::y((Vector3<short> *)&riamd._magnetometer._z);
                bVar2 = true;
                if (sVar5 == sVar6) {
                  ximu::RawInertialAndMagneticData::accelerometer
                            ((RawInertialAndMagneticData *)(local_40a + 6));
                  sVar5 = ximu::Vector3<short>::z((Vector3<short> *)(local_40a + 6));
                  sVar6 = ximu::Vector3<short>::z((Vector3<short> *)&riamd._magnetometer._z);
                  bVar2 = true;
                  if (sVar5 == sVar6) {
                    ximu::RawInertialAndMagneticData::magnetometer
                              ((RawInertialAndMagneticData *)local_40a);
                    sVar5 = ximu::Vector3<short>::x((Vector3<short> *)local_40a);
                    sVar6 = ximu::Vector3<short>::x((Vector3<short> *)&riamd._accelerometer._z);
                    bVar2 = true;
                    if (sVar5 == sVar6) {
                      ximu::RawInertialAndMagneticData::magnetometer
                                ((RawInertialAndMagneticData *)&dpb2);
                      sVar5 = ximu::Vector3<short>::y((Vector3<short> *)&dpb2);
                      sVar6 = ximu::Vector3<short>::y((Vector3<short> *)&riamd._accelerometer._z);
                      bVar2 = true;
                      if (sVar5 == sVar6) {
                        ximu::RawInertialAndMagneticData::magnetometer
                                  ((RawInertialAndMagneticData *)((long)&portIndex + 2));
                        sVar5 = ximu::Vector3<short>::z((Vector3<short> *)((long)&portIndex + 2));
                        sVar6 = ximu::Vector3<short>::z((Vector3<short> *)&riamd._accelerometer._z);
                        bVar2 = sVar5 != sVar6;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if (bVar2) {
          argv_local._4_4_ = 1;
        }
        else {
          ximu::DigitalPortBits::DigitalPortBits
                    ((DigitalPortBits *)((long)&portIndex + 1),false,false,false,false,false,false,
                     false,false);
          ximu::DigitalPortBits::DigitalPortBits
                    ((DigitalPortBits *)&portIndex,true,true,true,true,true,true,true,true);
          for (sStack_420 = 0; sStack_420 != 8; sStack_420 = sStack_420 + 1) {
            bVar2 = ximu::DigitalPortBits::get((DigitalPortBits *)((long)&portIndex + 1),sStack_420)
            ;
            if (bVar2) {
              argv_local._4_4_ = 1;
              goto LAB_0010e01c;
            }
            bVar2 = ximu::DigitalPortBits::get((DigitalPortBits *)&portIndex,sStack_420);
            if (!bVar2) {
              argv_local._4_4_ = 1;
              goto LAB_0010e01c;
            }
          }
          uVar3 = ximu::DigitalPortBits::byte((DigitalPortBits *)((long)&portIndex + 1));
          if ((uVar3 == '\0') &&
             (uVar3 = ximu::DigitalPortBits::byte((DigitalPortBits *)&portIndex), uVar3 == 0xff)) {
            ximu::DigitalPortBits::DigitalPortBits
                      ((DigitalPortBits *)
                       ((long)&fTestSet.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7),'\0');
            bVar2 = ximu::operator!=((DigitalPortBits *)((long)&portIndex + 1),
                                     (DigitalPortBits *)
                                     ((long)&fTestSet.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7))
            ;
            local_7c2 = true;
            if (!bVar2) {
              ximu::DigitalPortBits::DigitalPortBits
                        ((DigitalPortBits *)
                         ((long)&fTestSet.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + 6),0xff);
              bVar2 = ximu::operator!=((DigitalPortBits *)&portIndex,
                                       (DigitalPortBits *)
                                       ((long)&fTestSet.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage + 6
                                       ));
              local_7c2 = true;
              if (!bVar2) {
                local_7c2 = ximu::operator==((DigitalPortBits *)((long)&portIndex + 1),
                                             (DigitalPortBits *)&portIndex);
              }
            }
            if (local_7c2 == false) {
              bVar2 = ximu::DigitalPortBits::ax0((DigitalPortBits *)((long)&portIndex + 1));
              if ((bVar2) ||
                 (bVar2 = ximu::DigitalPortBits::ax0((DigitalPortBits *)&portIndex), !bVar2)) {
                argv_local._4_4_ = 1;
              }
              else {
                bVar2 = ximu::DigitalPortBits::ax1((DigitalPortBits *)((long)&portIndex + 1));
                if ((bVar2) ||
                   (bVar2 = ximu::DigitalPortBits::ax1((DigitalPortBits *)&portIndex), !bVar2)) {
                  argv_local._4_4_ = 1;
                }
                else {
                  bVar2 = ximu::DigitalPortBits::ax2((DigitalPortBits *)((long)&portIndex + 1));
                  if ((bVar2) ||
                     (bVar2 = ximu::DigitalPortBits::ax2((DigitalPortBits *)&portIndex), !bVar2)) {
                    argv_local._4_4_ = 1;
                  }
                  else {
                    bVar2 = ximu::DigitalPortBits::ax3((DigitalPortBits *)((long)&portIndex + 1));
                    if ((bVar2) ||
                       (bVar2 = ximu::DigitalPortBits::ax3((DigitalPortBits *)&portIndex), !bVar2))
                    {
                      argv_local._4_4_ = 1;
                    }
                    else {
                      bVar2 = ximu::DigitalPortBits::ax4((DigitalPortBits *)((long)&portIndex + 1));
                      if ((bVar2) ||
                         (bVar2 = ximu::DigitalPortBits::ax4((DigitalPortBits *)&portIndex), !bVar2)
                         ) {
                        argv_local._4_4_ = 1;
                      }
                      else {
                        bVar2 = ximu::DigitalPortBits::ax5
                                          ((DigitalPortBits *)((long)&portIndex + 1));
                        if ((bVar2) ||
                           (bVar2 = ximu::DigitalPortBits::ax5((DigitalPortBits *)&portIndex),
                           !bVar2)) {
                          argv_local._4_4_ = 1;
                        }
                        else {
                          bVar2 = ximu::DigitalPortBits::ax6
                                            ((DigitalPortBits *)((long)&portIndex + 1));
                          if ((bVar2) ||
                             (bVar2 = ximu::DigitalPortBits::ax6((DigitalPortBits *)&portIndex),
                             !bVar2)) {
                            argv_local._4_4_ = 1;
                          }
                          else {
                            bVar2 = ximu::DigitalPortBits::ax7
                                              ((DigitalPortBits *)((long)&portIndex + 1));
                            if ((bVar2) ||
                               (bVar2 = ximu::DigitalPortBits::ax7((DigitalPortBits *)&portIndex),
                               !bVar2)) {
                              argv_local._4_4_ = 1;
                            }
                            else {
                              ximu::DigitalIOData::DigitalIOData
                                        ((DigitalIOData *)
                                         ((long)&fTestSet.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_end_of_storage +
                                         4),(DigitalPortBits *)((long)&portIndex + 1),
                                         (DigitalPortBits *)&portIndex);
                              ximu::DigitalIOData::direction
                                        ((DigitalIOData *)
                                         ((long)&fTestSet.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_end_of_storage +
                                         3));
                              bVar2 = ximu::operator!=((DigitalPortBits *)
                                                       ((long)&fTestSet.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 3),(DigitalPortBits *)((long)&portIndex + 1));
                              if (bVar2) {
                                argv_local._4_4_ = 1;
                              }
                              else {
                                ximu::DigitalIOData::state
                                          ((DigitalIOData *)
                                           ((long)&fTestSet.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 2));
                                bVar2 = ximu::operator!=((DigitalPortBits *)
                                                         ((long)&fTestSet.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 2),(DigitalPortBits *)&portIndex);
                                if (bVar2) {
                                  argv_local._4_4_ = 1;
                                }
                                else {
                                  stack0xfffffffffffffb88 = 0x7f7fffff00800000;
                                  paVar1 = (allocator<float> *)
                                           ((long)&carInTest.super_EightChannelData<float>._channelG
                                           + 3);
                                  std::allocator<float>::allocator(paVar1);
                                  __l_03._M_len = 8;
                                  __l_03._M_array =
                                       &carInTest.super_EightChannelData<float>._channelH;
                                  std::vector<float,_std::allocator<float>_>::vector
                                            ((vector<float,_std::allocator<float>_> *)local_440,
                                             __l_03,paVar1);
                                  std::allocator<float>::~allocator
                                            ((allocator<float> *)
                                             ((long)&carInTest.super_EightChannelData<float>.
                                                     _channelG + 3));
                                  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                                      ((vector<float,_std::allocator<float>_> *)
                                                       local_440,0);
                                  fVar19 = *pvVar10;
                                  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                                      ((vector<float,_std::allocator<float>_> *)
                                                       local_440,1);
                                  fVar20 = *pvVar10;
                                  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                                      ((vector<float,_std::allocator<float>_> *)
                                                       local_440,2);
                                  c_00 = *pvVar10;
                                  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                                      ((vector<float,_std::allocator<float>_> *)
                                                       local_440,3);
                                  d = *pvVar10;
                                  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                                      ((vector<float,_std::allocator<float>_> *)
                                                       local_440,4);
                                  e = *pvVar10;
                                  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                                      ((vector<float,_std::allocator<float>_> *)
                                                       local_440,5);
                                  f = *pvVar10;
                                  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                                      ((vector<float,_std::allocator<float>_> *)
                                                       local_440,6);
                                  g = *pvVar10;
                                  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                                      ((vector<float,_std::allocator<float>_> *)
                                                       local_440,7);
                                  ximu::CalAnalogueInputData::CalAnalogueInputData
                                            ((CalAnalogueInputData *)
                                             ((long)&sTestSet.
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4),fVar19,fVar20,c_00,d,e,f,g,*pvVar10);
                                  pfVar11 = ximu::EightChannelData<float>::a
                                                      ((EightChannelData<float> *)
                                                       ((long)&sTestSet.
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4));
                                  fVar19 = *pfVar11;
                                  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                                      ((vector<float,_std::allocator<float>_> *)
                                                       local_440,0);
                                  bVar2 = CompareFloates(fVar19,*pvVar10);
                                  if (bVar2) {
                                    pfVar11 = ximu::EightChannelData<float>::b
                                                        ((EightChannelData<float> *)
                                                         ((long)&sTestSet.
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4));
                                    fVar19 = *pfVar11;
                                    pvVar18 = (void *)0x1;
                                    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                                        ((vector<float,_std::allocator<float>_> *)
                                                         local_440,1);
                                    bVar2 = CompareFloates(fVar19,*pvVar10);
                                    if (!bVar2) goto LAB_0010d075;
                                    iVar8 = ximu::EightChannelData<float>::c
                                                      ((EightChannelData<float> *)
                                                       ((long)&sTestSet.
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4),pvVar18,extraout_RDX);
                                    fVar19 = *(float *)CONCAT44(extraout_var,iVar8);
                                    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                                        ((vector<float,_std::allocator<float>_> *)
                                                         local_440,2);
                                    bVar2 = CompareFloates(fVar19,*pvVar10);
                                    if (!bVar2) goto LAB_0010d075;
                                    pfVar11 = ximu::EightChannelData<float>::d
                                                        ((EightChannelData<float> *)
                                                         ((long)&sTestSet.
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4));
                                    fVar19 = *pfVar11;
                                    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                                        ((vector<float,_std::allocator<float>_> *)
                                                         local_440,3);
                                    bVar2 = CompareFloates(fVar19,*pvVar10);
                                    if (!bVar2) goto LAB_0010d075;
                                    pfVar11 = ximu::EightChannelData<float>::e
                                                        ((EightChannelData<float> *)
                                                         ((long)&sTestSet.
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4));
                                    fVar19 = *pfVar11;
                                    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                                        ((vector<float,_std::allocator<float>_> *)
                                                         local_440,4);
                                    bVar2 = CompareFloates(fVar19,*pvVar10);
                                    if (!bVar2) goto LAB_0010d075;
                                    pfVar11 = ximu::EightChannelData<float>::f
                                                        ((EightChannelData<float> *)
                                                         ((long)&sTestSet.
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4));
                                    fVar19 = *pfVar11;
                                    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                                        ((vector<float,_std::allocator<float>_> *)
                                                         local_440,5);
                                    bVar2 = CompareFloates(fVar19,*pvVar10);
                                    if (!bVar2) goto LAB_0010d075;
                                    pfVar11 = ximu::EightChannelData<float>::g
                                                        ((EightChannelData<float> *)
                                                         ((long)&sTestSet.
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4));
                                    fVar19 = *pfVar11;
                                    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                                        ((vector<float,_std::allocator<float>_> *)
                                                         local_440,6);
                                    bVar2 = CompareFloates(fVar19,*pvVar10);
                                    if (!bVar2) goto LAB_0010d075;
                                    pfVar11 = ximu::EightChannelData<float>::h
                                                        ((EightChannelData<float> *)
                                                         ((long)&sTestSet.
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4));
                                    fVar19 = *pfVar11;
                                    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                                        ((vector<float,_std::allocator<float>_> *)
                                                         local_440,7);
                                    bVar2 = CompareFloates(fVar19,*pvVar10);
                                    if (!bVar2) goto LAB_0010d075;
                                    rawInTest.super_EightChannelData<short>._channelF =
                                         std::numeric_limits<short>::min();
                                    rawInTest.super_EightChannelData<short>._channelG =
                                         std::numeric_limits<short>::max();
                                    rawInTest.super_EightChannelData<short>._channelH = 2;
                                    this = (allocator<short> *)
                                           ((long)&rawInTest.super_EightChannelData<short>._channelE
                                           + 1);
                                    std::allocator<short>::allocator(this);
                                    __l_02._M_len = 8;
                                    __l_02._M_array =
                                         &rawInTest.super_EightChannelData<short>._channelF;
                                    std::vector<short,_std::allocator<short>_>::vector
                                              ((vector<short,_std::allocator<short>_> *)local_4b8,
                                               __l_02,this);
                                    std::allocator<short>::~allocator
                                              ((allocator<short> *)
                                               ((long)&rawInTest.super_EightChannelData<short>.
                                                       _channelE + 1));
                                    pvVar12 = std::vector<short,_std::allocator<short>_>::operator[]
                                                        ((vector<short,_std::allocator<short>_> *)
                                                         local_4b8,0);
                                    sVar5 = *pvVar12;
                                    pvVar12 = std::vector<short,_std::allocator<short>_>::operator[]
                                                        ((vector<short,_std::allocator<short>_> *)
                                                         local_4b8,1);
                                    sVar6 = *pvVar12;
                                    pvVar12 = std::vector<short,_std::allocator<short>_>::operator[]
                                                        ((vector<short,_std::allocator<short>_> *)
                                                         local_4b8,2);
                                    c_01 = *pvVar12;
                                    pvVar12 = std::vector<short,_std::allocator<short>_>::operator[]
                                                        ((vector<short,_std::allocator<short>_> *)
                                                         local_4b8,3);
                                    d_00 = *pvVar12;
                                    pvVar12 = std::vector<short,_std::allocator<short>_>::operator[]
                                                        ((vector<short,_std::allocator<short>_> *)
                                                         local_4b8,4);
                                    e_00 = *pvVar12;
                                    pvVar12 = std::vector<short,_std::allocator<short>_>::operator[]
                                                        ((vector<short,_std::allocator<short>_> *)
                                                         local_4b8,5);
                                    f_00 = *pvVar12;
                                    pvVar12 = std::vector<short,_std::allocator<short>_>::operator[]
                                                        ((vector<short,_std::allocator<short>_> *)
                                                         local_4b8,6);
                                    g_00 = *pvVar12;
                                    pvVar12 = std::vector<short,_std::allocator<short>_>::operator[]
                                                        ((vector<short,_std::allocator<short>_> *)
                                                         local_4b8,7);
                                    ximu::RawAnalogueInputData::RawAnalogueInputData
                                              ((RawAnalogueInputData *)
                                               ((long)&vec3fTestSet.
                                                                                                              
                                                  super__Vector_base<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               + 6),sVar5,sVar6,c_01,d_00,e_00,f_00,g_00,*pvVar12);
                                    bVar7 = ximu::EightChannelData<short>::a
                                                      ((EightChannelData<short> *)
                                                       ((long)&vec3fTestSet.
                                                                                                                              
                                                  super__Vector_base<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 6));
                                    pvVar12 = std::vector<short,_std::allocator<short>_>::operator[]
                                                        ((vector<short,_std::allocator<short>_> *)
                                                         local_4b8,0);
                                    if (bVar7 == *pvVar12) {
                                      bVar7 = ximu::EightChannelData<short>::b
                                                        ((EightChannelData<short> *)
                                                         ((long)&vec3fTestSet.
                                                                                                                                  
                                                  super__Vector_base<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 6));
                                      pvVar18 = (void *)0x1;
                                      pvVar12 = std::vector<short,_std::allocator<short>_>::
                                                operator[]((vector<short,_std::allocator<short>_> *)
                                                           local_4b8,1);
                                      if (bVar7 != *pvVar12) goto LAB_0010d4be;
                                      iVar8 = ximu::EightChannelData<short>::c
                                                        ((EightChannelData<short> *)
                                                         ((long)&vec3fTestSet.
                                                                                                                                  
                                                  super__Vector_base<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 6),pvVar18,extraout_RDX_00);
                                      pvVar12 = std::vector<short,_std::allocator<short>_>::
                                                operator[]((vector<short,_std::allocator<short>_> *)
                                                           local_4b8,2);
                                      if ((short)iVar8 != *pvVar12) goto LAB_0010d4be;
                                      bVar7 = ximu::EightChannelData<short>::d
                                                        ((EightChannelData<short> *)
                                                         ((long)&vec3fTestSet.
                                                                                                                                  
                                                  super__Vector_base<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 6));
                                      pvVar12 = std::vector<short,_std::allocator<short>_>::
                                                operator[]((vector<short,_std::allocator<short>_> *)
                                                           local_4b8,3);
                                      if (bVar7 != *pvVar12) goto LAB_0010d4be;
                                      bVar7 = ximu::EightChannelData<short>::e
                                                        ((EightChannelData<short> *)
                                                         ((long)&vec3fTestSet.
                                                                                                                                  
                                                  super__Vector_base<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 6));
                                      pvVar12 = std::vector<short,_std::allocator<short>_>::
                                                operator[]((vector<short,_std::allocator<short>_> *)
                                                           local_4b8,4);
                                      if (bVar7 != *pvVar12) goto LAB_0010d4be;
                                      bVar7 = ximu::EightChannelData<short>::f
                                                        ((EightChannelData<short> *)
                                                         ((long)&vec3fTestSet.
                                                                                                                                  
                                                  super__Vector_base<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 6));
                                      pvVar12 = std::vector<short,_std::allocator<short>_>::
                                                operator[]((vector<short,_std::allocator<short>_> *)
                                                           local_4b8,5);
                                      if (bVar7 != *pvVar12) goto LAB_0010d4be;
                                      bVar7 = ximu::EightChannelData<short>::g
                                                        ((EightChannelData<short> *)
                                                         ((long)&vec3fTestSet.
                                                                                                                                  
                                                  super__Vector_base<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 6));
                                      pvVar12 = std::vector<short,_std::allocator<short>_>::
                                                operator[]((vector<short,_std::allocator<short>_> *)
                                                           local_4b8,6);
                                      if (bVar7 != *pvVar12) goto LAB_0010d4be;
                                      bVar7 = ximu::EightChannelData<short>::h
                                                        ((EightChannelData<short> *)
                                                         ((long)&vec3fTestSet.
                                                                                                                                  
                                                  super__Vector_base<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 6));
                                      pvVar12 = std::vector<short,_std::allocator<short>_>::
                                                operator[]((vector<short,_std::allocator<short>_> *)
                                                           local_4b8,7);
                                      if (bVar7 != *pvVar12) goto LAB_0010d4be;
                                      fVar19 = std::numeric_limits<float>::min();
                                      ximu::Vector3<float>::Vector3
                                                ((Vector3<float> *)
                                                 &calBusData.
                                                  super_FourChannelData<ximu::Vector3<float>_>.
                                                  _channelD._z,fVar19,0.0,12.12);
                                      fVar19 = std::numeric_limits<float>::max();
                                      ximu::Vector3<float>::Vector3(&local_53c,fVar19,-12.12,53.85);
                                      ximu::Vector3<float>::Vector3(&local_530,0.0,0.0,0.0);
                                      ximu::Vector3<float>::Vector3(&local_524,12.12,-56.12,45.89);
                                      local_518 = (iterator)
                                                  &calBusData.
                                                   super_FourChannelData<ximu::Vector3<float>_>.
                                                   _channelD._z;
                                      local_510 = 4;
                                      this_00 = (allocator<ximu::Vector3<float>_> *)
                                                ((long)&calBusData.
                                                        super_FourChannelData<ximu::Vector3<float>_>
                                                        ._channelD._y + 3);
                                      std::allocator<ximu::Vector3<float>_>::allocator(this_00);
                                      __l_01._M_len = local_510;
                                      __l_01._M_array = local_518;
                                      std::
                                      vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                      ::vector((vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                *)local_508,__l_01,this_00);
                                      std::allocator<ximu::Vector3<float>_>::~allocator
                                                ((allocator<ximu::Vector3<float>_> *)
                                                 ((long)&calBusData.
                                                                                                                  
                                                  super_FourChannelData<ximu::Vector3<float>_>.
                                                  _channelD._y + 3));
                                      pvVar13 = std::
                                                vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                ::operator[]((
                                                  vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  *)local_508,0);
                                      ximu::Vector3<float>::Vector3(&local_588,pvVar13);
                                      pvVar13 = std::
                                                vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                ::operator[]((
                                                  vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  *)local_508,1);
                                      ximu::Vector3<float>::Vector3(&local_594,pvVar13);
                                      pvVar13 = std::
                                                vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                ::operator[]((
                                                  vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  *)local_508,2);
                                      ximu::Vector3<float>::Vector3(&local_5a0,pvVar13);
                                      pvVar13 = std::
                                                vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                ::operator[]((
                                                  vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  *)local_508,3);
                                      ximu::Vector3<float>::Vector3
                                                ((Vector3<float> *)
                                                 ((long)&vec3sTestSet.
                                                                                                                  
                                                  super__Vector_base<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 + 4),pvVar13);
                                      ximu::CalAdxl345BusData::CalAdxl345BusData
                                                ((CalAdxl345BusData *)local_57c,&local_588,
                                                 &local_594,&local_5a0,
                                                 (Vector3f *)
                                                 ((long)&vec3sTestSet.
                                                                                                                  
                                                  super__Vector_base<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 + 4));
                                      pVVar14 = ximu::FourChannelData<ximu::Vector3<float>_>::a
                                                          ((FourChannelData<ximu::Vector3<float>_> *
                                                           )local_57c);
                                      fVar19 = ximu::Vector3<float>::x(pVVar14);
                                      pvVar13 = std::
                                                vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                ::operator[]((
                                                  vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  *)local_508,0);
                                      fVar20 = ximu::Vector3<float>::x(pvVar13);
                                      bVar2 = CompareFloates(fVar19,fVar20);
                                      if (bVar2) {
                                        pVVar14 = ximu::FourChannelData<ximu::Vector3<float>_>::b
                                                            ((FourChannelData<ximu::Vector3<float>_>
                                                              *)local_57c);
                                        fVar19 = ximu::Vector3<float>::y(pVVar14);
                                        pvVar18 = (void *)0x1;
                                        pvVar13 = std::
                                                  vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  ::operator[]((
                                                  vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  *)local_508,1);
                                        fVar20 = ximu::Vector3<float>::y(pvVar13);
                                        bVar2 = CompareFloates(fVar19,fVar20);
                                        if (!bVar2) goto LAB_0010d7e1;
                                        iVar8 = ximu::FourChannelData<ximu::Vector3<float>_>::c
                                                          ((FourChannelData<ximu::Vector3<float>_> *
                                                           )local_57c,pvVar18,extraout_RDX_01);
                                        fVar19 = ximu::Vector3<float>::z
                                                           ((Vector3<float> *)
                                                            CONCAT44(extraout_var_00,iVar8));
                                        pvVar13 = std::
                                                  vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  ::operator[]((
                                                  vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  *)local_508,2);
                                        fVar20 = ximu::Vector3<float>::z(pvVar13);
                                        bVar2 = CompareFloates(fVar19,fVar20);
                                        if (!bVar2) goto LAB_0010d7e1;
                                        sVar5 = std::numeric_limits<short>::min();
                                        ximu::Vector3<short>::Vector3
                                                  (&rawBusData.
                                                    super_FourChannelData<ximu::Vector3<short>_>.
                                                    _channelD,sVar5,0,0xc);
                                        sVar5 = std::numeric_limits<short>::max();
                                        ximu::Vector3<short>::Vector3(&local_5ea,sVar5,-0xc,0x35);
                                        ximu::Vector3<short>::Vector3(&local_5e4,0,0,0);
                                        ximu::Vector3<short>::Vector3(&local_5de,0xc,-0x38,0x2d);
                                        local_5d8 = &rawBusData.
                                                     super_FourChannelData<ximu::Vector3<short>_>.
                                                     _channelD;
                                        local_5d0 = 4;
                                        this_01 = (allocator<ximu::Vector3<short>_> *)
                                                  ((long)&rawBusData.
                                                                                                                    
                                                  super_FourChannelData<ximu::Vector3<short>_>.
                                                  _channelC._z + 1);
                                        std::allocator<ximu::Vector3<short>_>::allocator(this_01);
                                        __l_00._M_len = local_5d0;
                                        __l_00._M_array = local_5d8;
                                        std::
                                        vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                        ::vector((vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  *)local_5c8,__l_00,this_01);
                                        std::allocator<ximu::Vector3<short>_>::~allocator
                                                  ((allocator<ximu::Vector3<short>_> *)
                                                   ((long)&rawBusData.
                                                                                                                      
                                                  super_FourChannelData<ximu::Vector3<short>_>.
                                                  _channelC._z + 1));
                                        pvVar15 = std::
                                                  vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  ::operator[]((
                                                  vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  *)local_5c8,0);
                                        ximu::Vector3<short>::Vector3(&local_610,pvVar15);
                                        pvVar15 = std::
                                                  vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  ::operator[]((
                                                  vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  *)local_5c8,1);
                                        ximu::Vector3<short>::Vector3(&local_616,pvVar15);
                                        pvVar15 = std::
                                                  vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  ::operator[]((
                                                  vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  *)local_5c8,2);
                                        ximu::Vector3<short>::Vector3(&local_61c,pvVar15);
                                        pvVar15 = std::
                                                  vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  ::operator[]((
                                                  vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  *)local_5c8,3);
                                        ximu::Vector3<short>::Vector3
                                                  ((Vector3<short> *)
                                                   ((long)&usTestSet.
                                                                                                                      
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 6),pvVar15);
                                        ximu::RawAdxl345BusData::RawAdxl345BusData
                                                  ((RawAdxl345BusData *)local_60a,&local_610,
                                                   &local_616,&local_61c,
                                                   (Vector3s *)
                                                   ((long)&usTestSet.
                                                                                                                      
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 6));
                                        pVVar16 = ximu::FourChannelData<ximu::Vector3<short>_>::a
                                                            ((FourChannelData<ximu::Vector3<short>_>
                                                              *)local_60a);
                                        sVar5 = ximu::Vector3<short>::x(pVVar16);
                                        pvVar15 = std::
                                                  vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  ::operator[]((
                                                  vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  *)local_5c8,0);
                                        sVar6 = ximu::Vector3<short>::x(pvVar15);
                                        if (sVar5 == sVar6) {
                                          pVVar16 = ximu::FourChannelData<ximu::Vector3<short>_>::b
                                                              ((
                                                  FourChannelData<ximu::Vector3<short>_> *)local_60a
                                                  );
                                          sVar5 = ximu::Vector3<short>::y(pVVar16);
                                          pvVar18 = (void *)0x1;
                                          pvVar15 = std::
                                                  vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  ::operator[]((
                                                  vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  *)local_5c8,1);
                                          sVar6 = ximu::Vector3<short>::y(pvVar15);
                                          if (sVar5 != sVar6) goto LAB_0010db06;
                                          iVar8 = ximu::FourChannelData<ximu::Vector3<short>_>::c
                                                            ((FourChannelData<ximu::Vector3<short>_>
                                                              *)local_60a,pvVar18,extraout_RDX_02);
                                          sVar5 = ximu::Vector3<short>::z
                                                            ((Vector3<short> *)
                                                             CONCAT44(extraout_var_01,iVar8));
                                          pvVar15 = std::
                                                  vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  ::operator[]((
                                                  vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  *)local_5c8,2);
                                          sVar6 = ximu::Vector3<short>::z(pvVar15);
                                          if (sVar5 != sVar6) goto LAB_0010db06;
                                          pwmOutputData.super_FourChannelData<unsigned_short>.
                                          _channelB = 0;
                                          pwmOutputData.super_FourChannelData<unsigned_short>.
                                          _channelC = 2;
                                          pwmOutputData.super_FourChannelData<unsigned_short>.
                                          _channelD = 4;
                                          this_02 = (allocator<unsigned_short> *)
                                                    ((long)&pwmOutputData.
                                                            super_FourChannelData<unsigned_short>.
                                                            _channelA + 1);
                                          std::allocator<unsigned_short>::allocator(this_02);
                                          __l._M_len = 4;
                                          __l._M_array = &pwmOutputData.
                                                          super_FourChannelData<unsigned_short>.
                                                          _channelB;
                                          std::
                                          vector<unsigned_short,_std::allocator<unsigned_short>_>::
                                          vector((vector<unsigned_short,_std::allocator<unsigned_short>_>
                                                  *)local_640,__l,this_02);
                                          std::allocator<unsigned_short>::~allocator
                                                    ((allocator<unsigned_short> *)
                                                     ((long)&pwmOutputData.
                                                             super_FourChannelData<unsigned_short>.
                                                             _channelA + 1));
                                          pvVar17 = std::
                                                  vector<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ::operator[]((
                                                  vector<unsigned_short,_std::allocator<unsigned_short>_>
                                                  *)local_640,0);
                                          uVar4 = *pvVar17;
                                          pvVar17 = std::
                                                  vector<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ::operator[]((
                                                  vector<unsigned_short,_std::allocator<unsigned_short>_>
                                                  *)local_640,1);
                                          a2 = *pvVar17;
                                          pvVar17 = std::
                                                  vector<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ::operator[]((
                                                  vector<unsigned_short,_std::allocator<unsigned_short>_>
                                                  *)local_640,2);
                                          a4 = *pvVar17;
                                          pvVar17 = std::
                                                  vector<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ::operator[]((
                                                  vector<unsigned_short,_std::allocator<unsigned_short>_>
                                                  *)local_640,3);
                                          ximu::PWMOutputData::PWMOutputData
                                                    ((PWMOutputData *)((long)&_themp0f + 2),uVar4,a2
                                                     ,a4,*pvVar17);
                                          _batVolt1f = 0.32;
                                          _themp1f = 37.5;
                                          cbatd._thermometer = 2.999;
                                          cbatd._batteryVoltage = -11.5;
                                          ximu::CalBatteryAndThermometerData::
                                          CalBatteryAndThermometerData
                                                    ((CalBatteryAndThermometerData *)&_themp1s,
                                                     &_batVolt1f,&_themp1f);
                                          fVar19 = ximu::CalBatteryAndThermometerData::
                                                   batteryVoltage((CalBatteryAndThermometerData *)
                                                                  &_themp1s);
                                          CompareFloates(fVar19,_batVolt1f);
                                          fVar19 = ximu::CalBatteryAndThermometerData::thermometer
                                                             ((CalBatteryAndThermometerData *)
                                                              &_themp1s);
                                          bVar2 = CompareFloates(fVar19,_themp1f);
                                          if (((bVar2 ^ 0xffU) & 1) == 0) {
                                            ximu::CalBatteryAndThermometerData::batteryVoltage
                                                      ((CalBatteryAndThermometerData *)&_themp1s,
                                                       &cbatd._thermometer);
                                            ximu::CalBatteryAndThermometerData::thermometer
                                                      ((CalBatteryAndThermometerData *)&_themp1s,
                                                       &cbatd._batteryVoltage);
                                            fVar19 = ximu::CalBatteryAndThermometerData::
                                                     batteryVoltage((CalBatteryAndThermometerData *)
                                                                    &_themp1s);
                                            CompareFloates(fVar19,cbatd._thermometer);
                                            fVar19 = ximu::CalBatteryAndThermometerData::thermometer
                                                               ((CalBatteryAndThermometerData *)
                                                                &_themp1s);
                                            bVar2 = CompareFloates(fVar19,cbatd._batteryVoltage);
                                            if (((bVar2 ^ 0xffU) & 1) == 0) {
                                              rbatd._thermometer = 0xb;
                                              rbatd._batteryVoltage = 0x15;
                                              local_682 = 5;
                                              local_684 = -5;
                                              ximu::RawBatteryAndThermometerData::
                                              RawBatteryAndThermometerData
                                                        (&local_688,&rbatd._thermometer,
                                                         &rbatd._batteryVoltage);
                                              sVar5 = ximu::RawBatteryAndThermometerData::
                                                      batteryVoltage(&local_688);
                                              if ((sVar5 == rbatd._thermometer) &&
                                                 (sVar5 = ximu::RawBatteryAndThermometerData::
                                                          thermometer(&local_688),
                                                 sVar5 == rbatd._batteryVoltage)) {
                                                ximu::RawBatteryAndThermometerData::batteryVoltage
                                                          (&local_688,&local_682);
                                                ximu::RawBatteryAndThermometerData::thermometer
                                                          (&local_688,&local_684);
                                                sVar5 = ximu::RawBatteryAndThermometerData::
                                                        batteryVoltage(&local_688);
                                                if ((sVar5 == local_682) &&
                                                   (sVar5 = ximu::RawBatteryAndThermometerData::
                                                            thermometer(&local_688),
                                                   sVar5 == local_684)) {
                                                  argv_local._4_4_ = 0;
                                                }
                                                else {
                                                  argv_local._4_4_ = 1;
                                                }
                                              }
                                              else {
                                                argv_local._4_4_ = 1;
                                              }
                                              ximu::RawBatteryAndThermometerData::
                                              ~RawBatteryAndThermometerData(&local_688);
                                            }
                                            else {
                                              argv_local._4_4_ = 1;
                                            }
                                          }
                                          else {
                                            argv_local._4_4_ = 1;
                                          }
                                          ximu::CalBatteryAndThermometerData::
                                          ~CalBatteryAndThermometerData
                                                    ((CalBatteryAndThermometerData *)&_themp1s);
                                          std::
                                          vector<unsigned_short,_std::allocator<unsigned_short>_>::
                                          ~vector((
                                                  vector<unsigned_short,_std::allocator<unsigned_short>_>
                                                  *)local_640);
                                        }
                                        else {
LAB_0010db06:
                                          argv_local._4_4_ = 1;
                                        }
                                        std::
                                        vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                        ::~vector((
                                                  vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  *)local_5c8);
                                      }
                                      else {
LAB_0010d7e1:
                                        argv_local._4_4_ = 1;
                                      }
                                      std::
                                      vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                      ::~vector((vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                 *)local_508);
                                    }
                                    else {
LAB_0010d4be:
                                      argv_local._4_4_ = 1;
                                    }
                                    std::vector<short,_std::allocator<short>_>::~vector
                                              ((vector<short,_std::allocator<short>_> *)local_4b8);
                                  }
                                  else {
LAB_0010d075:
                                    argv_local._4_4_ = 1;
                                  }
                                  std::vector<float,_std::allocator<float>_>::~vector
                                            ((vector<float,_std::allocator<float>_> *)local_440);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              argv_local._4_4_ = 1;
            }
          }
          else {
            argv_local._4_4_ = 1;
          }
        }
LAB_0010e01c:
        ximu::RawInertialAndMagneticData::~RawInertialAndMagneticData
                  ((RawInertialAndMagneticData *)(local_3e6 + 6));
      }
    }
    else {
      argv_local._4_4_ = 1;
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_290);
  }
  else {
    argv_local._4_4_ = 1;
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_248);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_210);
LAB_0010e088:
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_118);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
	// all input and ouput values have been testing with the c# version

	////////////////////////////////////////////////////////
	//                 RegisterData                       //
	////////////////////////////////////////////////////////

	ximu::RegisterData r1(
		ximu::reg::RegisterAddresses::ALGORITHM_TARE_QUAT_0, 1.234f);
	if (r1.value() != 32767)
		return 1;

	ximu::RegisterData r2(ximu::reg::RegisterAddresses::BATTERY_BIAS,
		static_cast<unsigned short>(148));
	if (r2.floatValue() != 0.578125)
		return 1;

	/////////////////////////////////////////////////////////
	//                 DateTimeData                        //
	/////////////////////////////////////////////////////////

	ximu::DateTimeData dtd1;
	if (dtd1.year() != 2000 || dtd1.month() != 1 || dtd1.day() != 1 ||
		dtd1.hours() != 0 || dtd1.minutes() != 0 || dtd1.seconds() != 0)
		return 1;

	// test the setters
	dtd1.year(2001);
	dtd1.month(2);
	dtd1.day(3);
	dtd1.hours(4);
	dtd1.minutes(5);
	dtd1.seconds(6);


	if (dtd1.year() != 2001 || dtd1.month() != 2 || dtd1.day() != 3 ||
		dtd1.hours() != 4 || dtd1.minutes() != 5 || dtd1.seconds() != 6)
		return 1;

	// test with c/c++ time struct
	std::chrono::system_clock::time_point now = std::chrono::system_clock::now();
	std::time_t tt = std::chrono::system_clock::to_time_t(now);
	std::tm l_tm = *localtime(&tt);

	ximu::DateTimeData dtd2(l_tm);

	if (l_tm.tm_year != dtd2.year() || l_tm.tm_mon != dtd2.month() ||
		l_tm.tm_mday != dtd2.day() || l_tm.tm_hour != dtd2.hours() ||
		l_tm.tm_min != dtd2.minutes() || l_tm.tm_sec != dtd2.seconds()
		)
		return 1;

	//////////////////////////////////////////////
	//            Quaternion                    //
	//////////////////////////////////////////////

	// Constructors
	ximu::Quaternion<float> q1;
	ximu::Quaternion<float> q2(1, 0, 0, 0);
	ximu::QuaternionData q3;  // typedef as float as in c#

	std::vector<float> qData = { 1.0f, 0.0f, 0.0f, 0.0f };
	ximu::QuaternionData q4(qData.begin(), qData.end());

	if (q1 != q2 || q1 != q3 || q1 != q4)
		return 1;

	// normalize
	ximu::QuaternionData q5(1, 2, 3, 4);
	q5.normalize();

	ximu::QuaternionData q6(0.182, 0.365, 0.547, 0.732);

	// test if the values are quite similar.
	if (!ximu::Utility::isWithinError(q5.values(), q6.values(), 0.01f))
		return 1;

	// conjugate
	ximu::QuaternionData q7(1, 2, 3, 4);
	if (q7.conjugate() != ximu::QuaternionData(1, -2, -3, -4))
		return 1;

	// euler angles
	std::vector<float> eulerAngles1 = { 78.690f, -47.166f, 168.690f };
	std::vector<float> eulerAngles2 = q5.eulerAngles();

	if (!ximu::Utility::isWithinError(eulerAngles1, eulerAngles2, 0.001f))
		return 1;

	// rotation matrix
	std::vector<float> rotationMatrix = {
		-0.666f, 0.666f, 0.333f,
		0.133f, -0.333f, 0.933f,
		0.733f, 0.666f, 0.133f
	};

	float a = rotationMatrix[6];
	float b = rotationMatrix[7];
	float c = rotationMatrix[8];

	if (!ximu::Utility::isWithinError(q5.rotationMatrix(), rotationMatrix, 0.01f))
		return 1;

	//////////////////////////////////////////////
	//        CalInertialAndMagneticData        //
	//////////////////////////////////////////////
	ximu::Vector3f gyro(1.0f, 2.0f, 3.0f);
	ximu::Vector3f acce(4.0f, 5.0f, 6.0f);
	ximu::Vector3f magn(7.0f, 8.0f, 9.0f);
	ximu::CalInertialAndMagneticData ciamd(gyro, acce, magn);

	if (ciamd.gyroscope().x() != gyro.x() ||
		ciamd.gyroscope().y() != gyro.y() ||
		ciamd.gyroscope().z() != gyro.z() ||
		ciamd.accelerometer().x() != acce.x() ||
		ciamd.accelerometer().y() != acce.y() ||
		ciamd.accelerometer().z() != acce.z() ||
		ciamd.magnetometer().x() != magn.x() ||
		ciamd.magnetometer().y() != magn.y() ||
		ciamd.magnetometer().z() != magn.z()) {

		return 1;
	}


	//////////////////////////////////////////////
	////        RawInertialAndMagneticData      //
	//////////////////////////////////////////////
	
	ximu::Vector3s gyro_r(1.0f, 2.0f, 3.0f);
	ximu::Vector3s acce_r(4.0f, 5.0f, 6.0f);
	ximu::Vector3s magn_r(7.0f, 8.0f, 9.0f);
	ximu::RawInertialAndMagneticData riamd(gyro_r, acce_r, magn_r);

	if (riamd.gyroscope().x() != gyro_r.x() ||
		riamd.gyroscope().y() != gyro_r.y() ||
		riamd.gyroscope().z() != gyro_r.z() ||
		riamd.accelerometer().x() != acce_r.x() ||
		riamd.accelerometer().y() != acce_r.y() ||
		riamd.accelerometer().z() != acce_r.z() ||
		riamd.magnetometer().x() != magn_r.x() ||
		riamd.magnetometer().y() != magn_r.y() ||
		riamd.magnetometer().z() != magn_r.z()) {

		return 1;
	}
	

	/////////////////////////////////
	// 	Digital Port Bits	 //
	/////////////////////////////////
	ximu::DigitalPortBits dpb1(false, false, false, false, false, false, false, false);
	ximu::DigitalPortBits dpb2(true, true, true, true, true, true, true, true);

	for (size_t portIndex = 0; portIndex != 8; ++portIndex) {
		if (dpb1.get(portIndex))
			return 1;
		if (!dpb2.get(portIndex))
			return 1;
	}

	if (dpb1.byte() != 0 || dpb2.byte() != 255)
		return 1;
	if (dpb1 != ximu::DigitalPortBits(0) || dpb2 != ximu::DigitalPortBits(255) || dpb1 == dpb2)
		return 1;


	if (dpb1.ax0() || !dpb2.ax0())
		return 1;
	if (dpb1.ax1() || !dpb2.ax1())
		return 1;
	if (dpb1.ax2() || !dpb2.ax2())
		return 1;
	if (dpb1.ax3() || !dpb2.ax3())
		return 1;
	if (dpb1.ax4() || !dpb2.ax4())
		return 1;
	if (dpb1.ax5() || !dpb2.ax5())
		return 1;
	if (dpb1.ax6() || !dpb2.ax6())
		return 1;
	if (dpb1.ax7() || !dpb2.ax7())
		return 1;

	/////////////////////
	// Digital IO Data //
	/////////////////////
	ximu::DigitalIOData diod1(dpb1, dpb2);
	if (diod1.direction() != dpb1)
		return 1;
	if (diod1.state() != dpb2)
		return 1;


	//////////////////////////////////////////////
	//            CalAnalogueInputData          //
	//////////////////////////////////////////////


	std::vector<float> fTestSet = { std::numeric_limits<float>::min(),
		std::numeric_limits<float>::max(),
		0.0f, 12.0f, -500.12f,
		0.014f, -1020.1234f, 12.4f };

	ximu::CalAnalogueInputData carInTest(fTestSet[0], fTestSet[1], fTestSet[2], fTestSet[3],
		fTestSet[4], fTestSet[5], fTestSet[6], fTestSet[7]);

	if (!CompareFloates(carInTest.a(), fTestSet[0]) || !CompareFloates(carInTest.b(), fTestSet[1]) ||
		!CompareFloates(carInTest.c(), fTestSet[2]) || !CompareFloates(carInTest.d(), fTestSet[3]) ||
		!CompareFloates(carInTest.e(), fTestSet[4]) || !CompareFloates(carInTest.f(), fTestSet[5]) ||
		!CompareFloates(carInTest.g(), fTestSet[6]) || !CompareFloates(carInTest.h(), fTestSet[7]))
		return 1;

	std::vector<short> sTestSet = { std::numeric_limits<short>::min(),
		std::numeric_limits<short>::max(),
		2, -2, 4, 555, -640, 1024 };

	//////////////////////////////////////////////
	//            RawAnalogueInputData          //
	//////////////////////////////////////////////

	ximu::RawAnalogueInputData rawInTest(sTestSet[0], sTestSet[1], sTestSet[2], sTestSet[3],
		sTestSet[4], sTestSet[5], sTestSet[6], sTestSet[7]);

	if (rawInTest.a() != sTestSet[0] || rawInTest.b() != sTestSet[1] ||
		rawInTest.c() != sTestSet[2] || rawInTest.d() != sTestSet[3] ||
		rawInTest.e() != sTestSet[4] || rawInTest.f() != sTestSet[5] ||
		rawInTest.g() != sTestSet[6] || rawInTest.h() != sTestSet[7])
		return 1;


	//////////////////////////////////////////////
	//            CalAdxl345BusData             //
	//////////////////////////////////////////////

	std::vector<ximu::Vector3f> vec3fTestSet = { ximu::Vector3f(std::numeric_limits<float>::min(), 0.0f, 12.12f),
		ximu::Vector3f(std::numeric_limits<float>::max(), -12.12f, 53.85f),
		ximu::Vector3f(0.0f, 0.0f, 0.0f),
		ximu::Vector3f(12.12f, -56.12f, 45.89f) };

	ximu::CalAdxl345BusData calBusData(vec3fTestSet[0], vec3fTestSet[1], vec3fTestSet[2], vec3fTestSet[3]);

	if (!CompareFloates(calBusData.a().x(), vec3fTestSet[0].x()) ||
		!CompareFloates(calBusData.b().y(), vec3fTestSet[1].y()) ||
		!CompareFloates(calBusData.c().z(), vec3fTestSet[2].z()))
		return 1;

	//////////////////////////////////////////////
	//            RawAdxl345BusData             //
	//////////////////////////////////////////////


	std::vector<ximu::Vector3s> vec3sTestSet = { ximu::Vector3s(std::numeric_limits<short>::min(), 0, 12),
		ximu::Vector3s(std::numeric_limits<short>::max(), -12, 53),
		ximu::Vector3s(0, 0, 0),
		ximu::Vector3s(12, -56, 45) };

	ximu::RawAdxl345BusData rawBusData(vec3sTestSet[0], vec3sTestSet[1], vec3sTestSet[2], vec3sTestSet[3]);

	if (rawBusData.a().x() != vec3sTestSet[0].x() ||
		rawBusData.b().y() != vec3sTestSet[1].y() ||
		rawBusData.c().z() != vec3sTestSet[2].z())
		return 1;


	//////////////////////////////////////////////
	//            PWMOutputData                 //
	//////////////////////////////////////////////

	std::vector<unsigned short> usTestSet{ 0, 2, 4, 6 };
	ximu::PWMOutputData pwmOutputData(usTestSet[0], usTestSet[1], usTestSet[2], usTestSet[3]);

	// getters are inherited as protected methods

	//if (pwmOutputData.a() != usTestSet[0] ||
	// pwmOutputData.b() != usTestSet[1] ||
	// pwmOutputData.c() != usTestSet[2] ||
	// pwmOutputData.d() != usTestSet[3])
	// return 1;


	//////////////////////////////////////////////
	//       CalBatteryAndThermometerData       //
	//////////////////////////////////////////////

	float _batVolt0f = 0.32;
	float _themp0f = 37.5;
	float _batVolt1f = 2.999;
	float _themp1f = -11.5;

	ximu::CalBatteryAndThermometerData cbatd(_batVolt0f, _themp0f);

	if (!CompareFloates(cbatd.batteryVoltage(), _batVolt0f), !CompareFloates(cbatd.thermometer(), _themp0f))
		return 1;
	
	cbatd.batteryVoltage(_batVolt1f);
	cbatd.thermometer(_themp1f);

	if (!CompareFloates(cbatd.batteryVoltage(), _batVolt1f), !CompareFloates(cbatd.thermometer(), _themp1f))
		return 1;


	short _batVolt0s = 11;
	short _themp0s = 21;
	short _batVolt1s = 5;
	short _themp1s = -5;

	//////////////////////////////////////////////
	//       RawBatteryAndThermometerData       //
	//////////////////////////////////////////////

	ximu::RawBatteryAndThermometerData rbatd(_batVolt0s, _themp0s);

	if (rbatd.batteryVoltage() != _batVolt0s || rbatd.thermometer() != _themp0s)
		return 1;

	rbatd.batteryVoltage(_batVolt1s);
	rbatd.thermometer(_themp1s);

	if (rbatd.batteryVoltage() != _batVolt1s || rbatd.thermometer() != _themp1s)
		return 1;
		

	return 0;
}